

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O3

void start_pass(j_decompress_ptr cinfo)

{
  jpeg_entropy_decoder *pjVar1;
  jpeg_error_mgr *pjVar2;
  jpeg_component_info *pjVar3;
  int iVar4;
  int iVar5;
  _func_boolean_j_decompress_ptr_JBLOCKROW_ptr *p_Var6;
  code *pcVar7;
  int (*paiVar8) [64];
  long lVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  
  pjVar1 = cinfo->entropy;
  iVar5 = cinfo->Ss;
  if (cinfo->progressive_mode == 0) {
    if ((((iVar5 != 0) || (cinfo->Ah != 0)) || (cinfo->Al != 0)) ||
       ((cinfo->Se < 0x40 && (cinfo->Se != cinfo->lim_Se)))) {
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 0x7d;
      (*pjVar2->emit_message)((j_common_ptr)cinfo,-1);
    }
    pjVar1->decode_mcu = decode_mcu;
    iVar5 = cinfo->comps_in_scan;
    goto LAB_00114b20;
  }
  iVar10 = cinfo->Se;
  if (iVar5 == 0) {
    if (iVar10 == 0) goto LAB_00114997;
LAB_001149b8:
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x11;
    (pjVar2->msg_parm).i[0] = iVar5;
    (cinfo->err->msg_parm).i[1] = cinfo->Se;
    (cinfo->err->msg_parm).i[2] = cinfo->Ah;
    (cinfo->err->msg_parm).i[3] = cinfo->Al;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  else {
    if (((iVar10 < iVar5) || (cinfo->lim_Se < iVar10)) || (cinfo->comps_in_scan != 1))
    goto LAB_001149b8;
LAB_00114997:
    if (cinfo->Ah == 0) {
      iVar10 = cinfo->Al;
    }
    else {
      iVar10 = cinfo->Ah + -1;
      if (iVar10 != cinfo->Al) goto LAB_001149b8;
    }
    if (0xd < iVar10) goto LAB_001149b8;
  }
  iVar5 = cinfo->comps_in_scan;
  if (0 < iVar5) {
    lVar9 = 0;
    do {
      iVar5 = cinfo->cur_comp_info[lVar9]->component_index;
      paiVar8 = cinfo->coef_bits + iVar5;
      iVar10 = 0;
      if ((cinfo->Ss != 0) && (iVar10 = cinfo->Ss, (*paiVar8)[0] < 0)) {
        pjVar2 = cinfo->err;
        pjVar2->msg_code = 0x76;
        (pjVar2->msg_parm).i[0] = iVar5;
        (cinfo->err->msg_parm).i[1] = 0;
        (*cinfo->err->emit_message)((j_common_ptr)cinfo,-1);
        iVar10 = cinfo->Ss;
      }
      if (iVar10 <= cinfo->Se) {
        lVar12 = (long)iVar10 + -1;
        do {
          iVar4 = (*paiVar8)[lVar12 + 1];
          if (iVar4 < 1) {
            iVar4 = 0;
          }
          if (cinfo->Ah != iVar4) {
            pjVar2 = cinfo->err;
            pjVar2->msg_code = 0x76;
            (pjVar2->msg_parm).i[0] = iVar5;
            (cinfo->err->msg_parm).i[1] = iVar10;
            (*cinfo->err->emit_message)((j_common_ptr)cinfo,-1);
          }
          (*paiVar8)[lVar12 + 1] = cinfo->Al;
          lVar12 = lVar12 + 1;
          iVar10 = iVar10 + 1;
        } while (lVar12 < cinfo->Se);
      }
      lVar9 = lVar9 + 1;
      iVar5 = cinfo->comps_in_scan;
    } while (lVar9 < iVar5);
  }
  if (cinfo->Ah == 0) {
    if (cinfo->Ss == 0) {
      pcVar7 = decode_mcu_DC_first;
    }
    else {
      pcVar7 = decode_mcu_AC_first;
    }
  }
  else if (cinfo->Ss == 0) {
    pcVar7 = decode_mcu_DC_refine;
  }
  else {
    pcVar7 = decode_mcu_AC_refine;
  }
  pjVar1->decode_mcu = pcVar7;
LAB_00114b20:
  if (0 < iVar5) {
    lVar9 = 0;
    do {
      pjVar3 = cinfo->cur_comp_info[lVar9];
      if (cinfo->progressive_mode == 0) {
LAB_00114b59:
        iVar5 = pjVar3->dc_tbl_no;
        uVar11 = (ulong)iVar5;
        if (0xf < uVar11) {
          pjVar2 = cinfo->err;
          pjVar2->msg_code = 0x32;
          (pjVar2->msg_parm).i[0] = iVar5;
          (*cinfo->err->error_exit)((j_common_ptr)cinfo);
        }
        p_Var6 = (&pjVar1[4].decode_mcu)[uVar11];
        if (p_Var6 == (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)0x0) {
          p_Var6 = (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)
                   (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x40);
          (&pjVar1[4].decode_mcu)[uVar11] = p_Var6;
        }
        *(undefined8 *)(p_Var6 + 0x30) = 0;
        *(undefined8 *)(p_Var6 + 0x38) = 0;
        *(undefined8 *)(p_Var6 + 0x20) = 0;
        *(undefined8 *)(p_Var6 + 0x28) = 0;
        *(undefined8 *)(p_Var6 + 0x10) = 0;
        *(undefined8 *)(p_Var6 + 0x18) = 0;
        *(undefined8 *)p_Var6 = 0;
        *(undefined8 *)(p_Var6 + 8) = 0;
        *(undefined4 *)((long)&pjVar1[2].start_pass + lVar9 * 4 + 4) = 0;
        *(undefined4 *)((long)&pjVar1[3].start_pass + lVar9 * 4 + 4) = 0;
        if (cinfo->progressive_mode == 0) {
          iVar5 = cinfo->lim_Se;
        }
        else {
          iVar5 = cinfo->Ss;
        }
        if (iVar5 != 0) {
LAB_00114bd4:
          iVar5 = pjVar3->ac_tbl_no;
          uVar11 = (ulong)iVar5;
          if (0xf < uVar11) {
            pjVar2 = cinfo->err;
            pjVar2->msg_code = 0x32;
            (pjVar2->msg_parm).i[0] = iVar5;
            (*cinfo->err->error_exit)((j_common_ptr)cinfo);
          }
          p_Var6 = (&pjVar1[0xc].decode_mcu)[uVar11];
          if (p_Var6 == (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)0x0) {
            p_Var6 = (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)
                     (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x100);
            (&pjVar1[0xc].decode_mcu)[uVar11] = p_Var6;
          }
          memset(p_Var6,0,0x100);
        }
      }
      else {
        if (cinfo->Ss != 0) goto LAB_00114bd4;
        if (cinfo->Ah == 0) goto LAB_00114b59;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < cinfo->comps_in_scan);
  }
  pjVar1[1].start_pass = (_func_void_j_decompress_ptr *)0x0;
  pjVar1[1].decode_mcu = (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)0x0;
  *(undefined4 *)&pjVar1[2].start_pass = 0xfffffff0;
  *(uint *)((long)&pjVar1[4].start_pass + 4) = cinfo->restart_interval;
  return;
}

Assistant:

METHODDEF(void)
start_pass (j_compress_ptr cinfo, boolean gather_statistics)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  int ci, tbl;
  jpeg_component_info * compptr;

  if (gather_statistics)
    /* Make sure to avoid that in the master control logic!
     * We are fully adaptive here and need no extra
     * statistics gathering pass!
     */
    ERREXIT(cinfo, JERR_NOT_COMPILED);

  /* We assume jcmaster.c already validated the progressive scan parameters. */

  /* Select execution routines */
  if (cinfo->progressive_mode) {
    if (cinfo->Ah == 0) {
      if (cinfo->Ss == 0)
	entropy->pub.encode_mcu = encode_mcu_DC_first;
      else
	entropy->pub.encode_mcu = encode_mcu_AC_first;
    } else {
      if (cinfo->Ss == 0)
	entropy->pub.encode_mcu = encode_mcu_DC_refine;
      else
	entropy->pub.encode_mcu = encode_mcu_AC_refine;
    }
  } else
    entropy->pub.encode_mcu = encode_mcu;

  /* Allocate & initialize requested statistics areas */
  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    /* DC needs no table for refinement scan */
    if (cinfo->Ss == 0 && cinfo->Ah == 0) {
      tbl = compptr->dc_tbl_no;
      if (tbl < 0 || tbl >= NUM_ARITH_TBLS)
	ERREXIT1(cinfo, JERR_NO_ARITH_TABLE, tbl);
      if (entropy->dc_stats[tbl] == NULL)
	entropy->dc_stats[tbl] = (unsigned char *) (*cinfo->mem->alloc_small)
	  ((j_common_ptr) cinfo, JPOOL_IMAGE, DC_STAT_BINS);
      MEMZERO(entropy->dc_stats[tbl], DC_STAT_BINS);
      /* Initialize DC predictions to 0 */
      entropy->last_dc_val[ci] = 0;
      entropy->dc_context[ci] = 0;
    }
    /* AC needs no table when not present */
    if (cinfo->Se) {
      tbl = compptr->ac_tbl_no;
      if (tbl < 0 || tbl >= NUM_ARITH_TBLS)
	ERREXIT1(cinfo, JERR_NO_ARITH_TABLE, tbl);
      if (entropy->ac_stats[tbl] == NULL)
	entropy->ac_stats[tbl] = (unsigned char *) (*cinfo->mem->alloc_small)
	  ((j_common_ptr) cinfo, JPOOL_IMAGE, AC_STAT_BINS);
      MEMZERO(entropy->ac_stats[tbl], AC_STAT_BINS);
#ifdef CALCULATE_SPECTRAL_CONDITIONING
      if (cinfo->progressive_mode)
	/* Section G.1.3.2: Set appropriate arithmetic conditioning value Kx */
	cinfo->arith_ac_K[tbl] = cinfo->Ss + ((8 + cinfo->Se - cinfo->Ss) >> 4);
#endif
    }
  }

  /* Initialize arithmetic encoding variables */
  entropy->c = 0;
  entropy->a = 0x10000L;
  entropy->sc = 0;
  entropy->zc = 0;
  entropy->ct = 11;
  entropy->buffer = -1;  /* empty */

  /* Initialize restart stuff */
  entropy->restarts_to_go = cinfo->restart_interval;
  entropy->next_restart_num = 0;
}